

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Stress::anon_unknown_0::RenderCase::drawTestPattern(RenderCase *this,bool useTexture)

{
  pointer *pppSVar1;
  RenderContext *pRVar2;
  code *pcVar3;
  TestLog *this_00;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  deUint32 err;
  RenderTarget *pRVar15;
  undefined4 extraout_var;
  void *__s;
  void *pvVar17;
  long lVar18;
  Surface *pSVar19;
  void *__buf;
  void *__buf_00;
  int x;
  int iVar20;
  long lVar21;
  char *pcVar22;
  int x_1;
  int iVar23;
  char *pcVar24;
  int iVar25;
  byte bVar26;
  int iVar27;
  int iVar28;
  int iVar30;
  int iVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  uint uVar33;
  uint uVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  RGBA col;
  undefined4 uStack_3fc;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  RenderCase *local_3e0;
  string local_3d8;
  undefined1 local_3b8 [16];
  GLuint textureID;
  ChannelType CStack_3a4;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  Surface resultImage;
  RGBA refColTexture;
  ChannelType CStack_354;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  TextureFormat *local_318;
  Surface errorMask;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  float local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  _Vector_impl_data local_1d8;
  ShaderProgram patternProgram;
  long lVar16;
  
  if (Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::fullscreenQuad == '\0') {
    _GLOBAL__N_1::RenderCase::drawTestPattern();
  }
  pcVar24 = 
  "varying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n}\n"
  ;
  if (useTexture) {
    pcVar24 = 
    "uniform mediump sampler2D u_sampler;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = texture2D(u_sampler, v_position.xy);\n}\n"
    ;
  }
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  bVar26 = 8 - (char)(pRVar15->m_pixelFormat).redBits;
  local_3b8._0_4_ = 0x100 << (8U - (char)(pRVar15->m_pixelFormat).greenBits & 0x1f);
  iVar20 = (pRVar15->m_pixelFormat).blueBits;
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pppSVar1 = &patternProgram.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"Drawing a test pattern to detect ",0x21);
  pcVar22 = ::glcts::fixed_sample_locations_values + 1;
  if (useTexture) {
    pcVar22 = "texture sampling";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,pcVar22,(ulong)useTexture << 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1," side-effects.",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar11);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3e0 = this;
  memset(local_288,0,0xac);
  local_1d8._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_1d8._M_finish._1_7_ = 0;
  stack0xfffffffffffffe38 = SUB169((undefined1  [16])0x0,7);
  _col = (pointer)&local_3f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&col,
             "attribute highp vec4 a_pos;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tv_position = a_pos;\n\tgl_Position = a_pos;\n}\n"
             ,"");
  _refColTexture = (TextureFormat)((ulong)_refColTexture & 0xffffffff00000000);
  local_350._0_8_ = &local_340;
  std::__cxx11::string::_M_construct<char*>((string *)local_350,_col,_col + local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)_refColTexture & 0xffffffff) * 0x18),(value_type *)local_350);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  pcVar22 = pcVar24 + 0x73;
  if (useTexture) {
    pcVar22 = pcVar24 + 0x8c;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,pcVar24,pcVar22);
  textureID = A;
  local_3a0._0_8_ = &local_390;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3a0,local_3d8._M_dataplus._M_p,
             local_3d8._M_dataplus._M_p + local_3d8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)_textureID & 0xffffffff) * 0x18),(value_type *)local_3a0);
  glu::ShaderProgram::ShaderProgram(&patternProgram,pRVar2,(ProgramSources *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != &local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ != &local_340) {
    operator_delete((void *)local_350._0_8_,local_340._M_allocated_capacity + 1);
  }
  local_3b8._0_4_ = local_3b8._0_4_ | 1 << (bVar26 & 0x1f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_col != &local_3f0) {
    operator_delete(_col,local_3f0._M_allocated_capacity + 1);
  }
  uVar12 = 0x10000 << (8U - (char)iVar20 & 0x1f) | local_3b8._0_4_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar21 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar21));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  uVar13 = (**(code **)(lVar16 + 0x780))(patternProgram.m_program.m_program);
  _textureID = (TextureFormat)((ulong)_textureID & 0xffffffff00000000);
  if (useTexture) {
    __s = operator_new(0x1000);
    lVar21 = 0;
    memset(__s,0,0x1000);
    auVar10 = _DAT_01bed2a0;
    auVar9 = _DAT_01aa42b0;
    auVar8 = _DAT_01a607c0;
    auVar7 = _DAT_01a607b0;
    auVar6 = _DAT_01a1fbc0;
    auVar5 = _s_validInterpolations;
    fVar37 = (float)DAT_01aa42b0;
    fVar38 = DAT_01aa42b0._4_4_;
    fVar39 = DAT_01aa42b0._8_4_;
    fVar40 = DAT_01aa42b0._12_4_;
    pvVar17 = __s;
    do {
      fVar42 = (float)(int)lVar21 * 0.03125 + -0.5;
      fVar41 = -fVar42;
      if (-fVar42 <= fVar42) {
        fVar41 = fVar42;
      }
      lVar18 = 0;
      auVar29 = auVar5;
      do {
        auVar43 = auVar29 & auVar6 | auVar7;
        auVar34._0_4_ = auVar29._0_4_ >> 0x10;
        uVar32 = auVar29._4_4_;
        auVar34._4_4_ = uVar32 >> 0x10;
        uVar33 = auVar29._8_4_;
        uVar36 = auVar29._12_4_;
        auVar34._8_4_ = uVar33 >> 0x10;
        auVar34._12_4_ = uVar36 >> 0x10;
        auVar34 = auVar34 | auVar8;
        auVar35._0_4_ = ((auVar34._0_4_ - 5.497642e+11) + auVar43._0_4_) * 0.03125 + -0.5;
        auVar35._4_4_ = ((auVar34._4_4_ - 5.497642e+11) + auVar43._4_4_) * 0.03125 + -0.5;
        auVar35._8_4_ = ((auVar34._8_4_ - 5.497642e+11) + auVar43._8_4_) * 0.03125 + -0.5;
        auVar35._12_4_ = ((auVar34._12_4_ - 5.497642e+11) + auVar43._12_4_) * 0.03125 + -0.5;
        uVar4 = CONCAT44(auVar35._4_4_,auVar35._0_4_);
        auVar44._0_8_ = uVar4 ^ 0x8000000080000000;
        auVar44._8_4_ = -auVar35._8_4_;
        auVar44._12_4_ = -auVar35._12_4_;
        auVar34 = maxps(auVar44,auVar35);
        auVar45._0_4_ = auVar34._0_4_ * fVar37 + fVar41 * fVar37;
        auVar45._4_4_ = auVar34._4_4_ * fVar38 + fVar41 * fVar38;
        auVar45._8_4_ = auVar34._8_4_ * fVar39 + fVar41 * fVar39;
        auVar45._12_4_ = auVar34._12_4_ * fVar40 + fVar41 * fVar40;
        auVar34 = minps(auVar9,auVar45);
        auVar43._0_4_ = (int)(float)(-(uint)(0.0 <= auVar45._0_4_) & auVar34._0_4_);
        auVar43._4_4_ = (int)(float)(-(uint)(0.0 <= auVar45._4_4_) & auVar34._4_4_);
        auVar43._8_4_ = (int)(float)(-(uint)(0.0 <= auVar45._8_4_) & auVar34._8_4_);
        auVar43._12_4_ = (int)(float)(-(uint)(0.0 <= auVar45._12_4_) & auVar34._12_4_);
        *(undefined1 (*) [16])((long)pvVar17 + lVar18 * 4) = auVar43 | auVar10;
        lVar18 = lVar18 + 4;
        auVar29._0_4_ = auVar29._0_4_ + 4;
        auVar29._4_4_ = uVar32 + 4;
        auVar29._8_4_ = uVar33 + 4;
        auVar29._12_4_ = uVar36 + 4;
      } while (lVar18 != 0x20);
      lVar21 = lVar21 + 1;
      pvVar17 = (void *)((long)pvVar17 + 0x80);
    } while (lVar21 != 0x20);
    (**(code **)(lVar16 + 0x6f8))(1,&textureID);
    (**(code **)(lVar16 + 0xb8))(0xde1,(ulong)_textureID & 0xffffffff);
    (**(code **)(lVar16 + 0x1310))(0xde1,0,0x1908,0x20,0x20,0,0x1908,0x1401,__s);
    (**(code **)(lVar16 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar16 + 0x1360))(0xde1,0x2801,0x2601);
    operator_delete(__s,0x1000);
  }
  (**(code **)(lVar16 + 0x1c0))(0,0,0);
  (**(code **)(lVar16 + 0x188))(0x4000);
  (**(code **)(lVar16 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar16 + 0x1680))(patternProgram.m_program.m_program);
  if (useTexture) {
    pcVar3 = *(code **)(lVar16 + 0x14f0);
    uVar14 = (**(code **)(lVar16 + 0xb48))(patternProgram.m_program.m_program,"u_sampler");
    (*pcVar3)(uVar14,0);
  }
  (**(code **)(lVar16 + 0x19f0))(uVar13,4,0x1406,0,0,drawTestPattern::fullscreenQuad);
  (**(code **)(lVar16 + 0x610))(uVar13);
  (**(code **)(lVar16 + 0x538))(5,0,4);
  (**(code **)(lVar16 + 0x518))(uVar13);
  (**(code **)(lVar16 + 0x1680))(0);
  (**(code **)(lVar16 + 0x648))();
  err = (**(code **)(lVar16 + 0x800))();
  glu::checkError(err,"RenderCase::drawTestPattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,299);
  if (textureID != 0) {
    (**(code **)(lVar16 + 0x480))(1,&textureID);
  }
  pRVar2 = ((local_3e0->super_TestCase).m_context)->m_renderCtx;
  refColTexture.m_value = RGBA;
  CStack_354 = UNORM_INT8;
  if (resultImage.m_pixels.m_cap != 0) {
    resultImage.m_pixels.m_cap = (size_t)resultImage.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&refColTexture,resultImage.m_width,
             resultImage.m_height,1,(void *)resultImage.m_pixels.m_cap);
  iVar20 = 0;
  glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_288);
  glu::ShaderProgram::~ShaderProgram(&patternProgram);
  local_318 = (TextureFormat *)&textureID;
  if (useTexture) {
    local_318 = (TextureFormat *)&refColTexture;
  }
  iVar11 = (1 << (bVar26 & 0x1f) & 0xffU) + 10;
  iVar27 = ((uint)local_3b8._0_4_ >> 8 & 0xff) + 10;
  iVar25 = (uVar12 >> 0x10 & 0xff) + 10;
  bVar26 = 0;
  do {
    fVar37 = ((float)iVar20 + (float)iVar20) * 0.00390625;
    local_3b8 = ZEXT416((uint)fVar37);
    fVar37 = floorf(fVar37);
    fVar37 = ((float)local_3b8._0_4_ - fVar37) + -0.5;
    uStack_294 = local_3b8._4_4_ ^ 0x80000000;
    uStack_290 = local_3b8._8_4_ ^ 0x80000000;
    uStack_28c = local_3b8._12_4_ ^ 0x80000000;
    local_298 = -fVar37;
    if (-fVar37 <= fVar37) {
      local_298 = fVar37;
    }
    local_298 = local_298 * 255.0;
    iVar23 = 0;
    do {
      fVar37 = (float)iVar23;
      local_3b8._0_4_ = fVar37;
      fVar38 = (fVar37 + fVar37) * 0.00390625;
      fVar37 = floorf(fVar38);
      fVar38 = (fVar38 - fVar37) + -0.5;
      fVar37 = -fVar38;
      if (-fVar38 <= fVar38) {
        fVar37 = fVar38;
      }
      fVar38 = fVar37 * 255.0 + local_298;
      fVar37 = 255.0;
      if (fVar38 <= 255.0) {
        fVar37 = fVar38;
      }
      _refColTexture =
           (TextureFormat)
           (CONCAT44(CStack_354,(int)(float)(~-(uint)(fVar38 < 0.0) & (uint)fVar37)) | 0xffffff00);
      _textureID = (TextureFormat)
                   (CONCAT44(CStack_3a4,(int)((float)local_3b8._0_4_ * 0.00390625 * 255.0)) |
                   0xffffff00);
      col.m_value = *(undefined4 *)
                     ((long)resultImage.m_pixels.m_ptr +
                     (long)(resultImage.m_width * iVar20 + iVar23) * 4);
      tcu::RGBA::toIVec((RGBA *)&patternProgram);
      tcu::RGBA::toIVec((RGBA *)local_288);
      uVar12 = (int)patternProgram.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start - local_288._0_4_ >> 0x1f;
      uVar32 = patternProgram.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_ - local_288._4_4_ >> 0x1f;
      uVar33 = (int)patternProgram.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - local_288._8_4_ >> 0x1f;
      iVar28 = ((int)patternProgram.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start - local_288._0_4_ ^ uVar12) - uVar12;
      iVar30 = (patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_ - local_288._4_4_ ^ uVar32) - uVar32;
      iVar31 = ((int)patternProgram.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - local_288._8_4_ ^ uVar33) - uVar33;
      uVar13 = 0xff00ff00;
      if (iVar25 < iVar31 || (iVar27 < iVar30 || iVar11 < iVar28)) {
        uVar13 = 0xff0000ff;
      }
      bVar26 = bVar26 | (iVar25 < iVar31 || (iVar27 < iVar30 || iVar11 < iVar28));
      *(undefined4 *)
       ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar20 + iVar23) * 4) = uVar13;
      iVar23 = iVar23 + 1;
    } while (iVar23 != 0x100);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 0x100);
  if (bVar26 == 0) {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((local_3e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"No side-effects found.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
  }
  else {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((local_3e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"Test pattern has missing/invalid pixels",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
    this_00 = ((local_3e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    _textureID = (TextureFormat)((long)local_3a0 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&textureID,"Results","");
    _col = (pointer)&local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&col,"Result verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&refColTexture,(string *)&textureID,(string *)&col)
    ;
    tcu::TestLog::startImageSet(this_00,(char *)_refColTexture,(char *)local_340._8_8_);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Result","");
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Result","");
    pSVar19 = &resultImage;
    tcu::LogImage::LogImage
              ((LogImage *)&patternProgram,&local_3d8,&local_2b8,pSVar19,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&patternProgram,(int)this_00,__buf,(size_t)pSVar19);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Error mask","");
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Error mask","");
    pSVar19 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)local_288,&local_2d8,&local_2f8,pSVar19,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_288,(int)this_00,__buf_00,(size_t)pSVar19);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != local_258) {
      operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
    }
    if ((undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_) != local_288 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_),
                      (ulong)(local_288._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
        patternProgram.m_shaders[1].
        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
        super__Vector_impl_data._M_finish != patternProgram.m_shaders + 2) {
      operator_delete(patternProgram.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      (long)patternProgram.m_shaders[2].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (patternProgram.m_shaders[0].
        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&patternProgram.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(patternProgram.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)patternProgram.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._8_8_ != &local_328) {
      operator_delete((void *)local_340._8_8_,local_328._M_allocated_capacity + 1);
    }
    if (_refColTexture != (TextureFormat)((long)local_350 + 8)) {
      operator_delete((void *)_refColTexture,local_350._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_col != &local_3f0) {
      operator_delete(_col,local_3f0._M_allocated_capacity + 1);
    }
    if (_textureID != (TextureFormat)((long)local_3a0 + 8)) {
      operator_delete((void *)_textureID,local_3a0._8_8_ + 1);
    }
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&resultImage);
  return (bool)~bVar26;
}

Assistant:

bool RenderCase::drawTestPattern (bool useTexture)
{
	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};
	const char* const	vertexSource		=	"attribute highp vec4 a_pos;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	v_position = a_pos;\n"
												"	gl_Position = a_pos;\n"
												"}\n";
	const char* const	fragmentSourceNoTex	=	"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n"
												"}\n";
	const char* const	fragmentSourceTex	=	"uniform mediump sampler2D u_sampler;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = texture2D(u_sampler, v_position.xy);\n"
												"}\n";
	const char* const	fragmentSource		=	(useTexture) ? (fragmentSourceTex) : (fragmentSourceNoTex);
	const tcu::RGBA		formatThreshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	tcu::Surface		resultImage			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface		errorMask			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool				error				=	false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a test pattern to detect " << ((useTexture) ? ("texture sampling") : ("")) << " side-effects." << tcu::TestLog::EndMessage;

	// draw pattern
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	patternProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));
		const GLint					positionLoc		= gl.getAttribLocation(patternProgram.getProgram(), "a_pos");
		GLuint						textureID		= 0;

		if (useTexture)
		{
			const int textureSize = 32;
			std::vector<tcu::Vector<deUint8, 4> > buffer(textureSize*textureSize);

			for (int x = 0; x < textureSize; ++x)
			for (int y = 0; y < textureSize; ++y)
			{
				// sum of two axis aligned gradients. Each gradient is 127 at the edges and 0 at the center.
				// pattern is symmetric (x and y) => no discontinuity near boundary => no need to worry of results with LINEAR filtering near boundaries
				const deUint8 redComponent = (deUint8)de::clamp(de::abs((float)x / (float)textureSize - 0.5f) * 255.0f + de::abs((float)y / (float)textureSize - 0.5f) * 255.0f, 0.0f, 255.0f);

				buffer[x * textureSize + y] = tcu::Vector<deUint8, 4>(redComponent, 255, 255, 255);
			}

			gl.genTextures(1, &textureID);
			gl.bindTexture(GL_TEXTURE_2D, textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, textureSize, textureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, buffer[0].getPtr());
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(patternProgram.getProgram());

		if (useTexture)
			gl.uniform1i(gl.getUniformLocation(patternProgram.getProgram(), "u_sampler"), 0);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &fullscreenQuad[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderCase::drawTestPattern");

		if (textureID)
			gl.deleteTextures(1, &textureID);

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify pattern
	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const float			texGradientPosX = deFloatFrac((float)x * 2.0f / (float)TEST_CANVAS_SIZE);
		const float			texGradientPosY = deFloatFrac((float)y * 2.0f / (float)TEST_CANVAS_SIZE);
		const deUint8		texRedComponent = (deUint8)de::clamp(de::abs(texGradientPosX - 0.5f) * 255.0f + de::abs(texGradientPosY - 0.5f) * 255.0f, 0.0f, 255.0f);

		const tcu::RGBA		refColTexture	= tcu::RGBA(texRedComponent, 255, 255, 255);
		const tcu::RGBA		refColGradient	= tcu::RGBA((int)((float)x / (float)TEST_CANVAS_SIZE * 255.0f), 255, 255, 255);
		const tcu::RGBA&	refCol			= (useTexture) ? (refColTexture) : (refColGradient);

		const int			colorThreshold	= 10;
		const tcu::RGBA		col				= resultImage.getPixel(x, y);
		const tcu::IVec4	colorDiff		= tcu::abs(col.toIVec() - refCol.toIVec());

		if (colorDiff.x() > formatThreshold.getRed()   + colorThreshold ||
			colorDiff.y() > formatThreshold.getGreen() + colorThreshold ||
			colorDiff.z() > formatThreshold.getBlue()  + colorThreshold)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
		else
			errorMask.setPixel(x, y, tcu::RGBA::green());
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test pattern has missing/invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		resultImage)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "No side-effects found." << tcu::TestLog::EndMessage;

	return !error;
}